

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unixShmPurge(unixFile *pFd)

{
  unixShmNode *p_00;
  int iVar1;
  int local_20;
  int i;
  int nShmPerMap;
  unixShmNode *p;
  unixFile *pFd_local;
  
  p_00 = pFd->pInode->pShmNode;
  if ((p_00 != (unixShmNode *)0x0) && (p_00->nRef == 0)) {
    iVar1 = unixShmRegionPerMap();
    sqlite3_mutex_free(p_00->mutex);
    for (local_20 = 0; local_20 < (int)(uint)p_00->nRegion; local_20 = iVar1 + local_20) {
      if (p_00->h < 0) {
        sqlite3_free(p_00->apRegion[local_20]);
      }
      else {
        (*aSyscall[0x17].pCurrent)(p_00->apRegion[local_20],(long)p_00->szRegion);
      }
    }
    sqlite3_free(p_00->apRegion);
    if (-1 < p_00->h) {
      robust_close(pFd,p_00->h,0x8737);
      p_00->h = -1;
    }
    p_00->pInode->pShmNode = (unixShmNode *)0x0;
    sqlite3_free(p_00);
  }
  return;
}

Assistant:

static void unixShmPurge(unixFile *pFd){
  unixShmNode *p = pFd->pInode->pShmNode;
  assert( unixMutexHeld() );
  if( p && ALWAYS(p->nRef==0) ){
    int nShmPerMap = unixShmRegionPerMap();
    int i;
    assert( p->pInode==pFd->pInode );
    sqlite3_mutex_free(p->mutex);
    for(i=0; i<p->nRegion; i+=nShmPerMap){
      if( p->h>=0 ){
        osMunmap(p->apRegion[i], p->szRegion);
      }else{
        sqlite3_free(p->apRegion[i]);
      }
    }
    sqlite3_free(p->apRegion);
    if( p->h>=0 ){
      robust_close(pFd, p->h, __LINE__);
      p->h = -1;
    }
    p->pInode->pShmNode = 0;
    sqlite3_free(p);
  }
}